

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_grpc.cpp
# Opt level: O0

bool flatbuffers::GenerateGoGRPC(Parser *parser,string *path,string *file_name)

{
  bool bVar1;
  reference ppSVar2;
  GoGRPCGenerator local_d8;
  __normal_iterator<flatbuffers::ServiceDef_*const_*,_std::vector<flatbuffers::ServiceDef_*,_std::allocator<flatbuffers::ServiceDef_*>_>_>
  local_40;
  __normal_iterator<flatbuffers::ServiceDef_*const_*,_std::vector<flatbuffers::ServiceDef_*,_std::allocator<flatbuffers::ServiceDef_*>_>_>
  local_38;
  const_iterator it;
  int nservices;
  string *file_name_local;
  string *path_local;
  Parser *parser_local;
  
  it._M_current._4_4_ = 0;
  local_38._M_current =
       (ServiceDef **)
       std::vector<flatbuffers::ServiceDef_*,_std::allocator<flatbuffers::ServiceDef_*>_>::begin
                 (&(parser->services_).vec);
  while( true ) {
    local_40._M_current =
         (ServiceDef **)
         std::vector<flatbuffers::ServiceDef_*,_std::allocator<flatbuffers::ServiceDef_*>_>::end
                   (&(parser->services_).vec);
    bVar1 = __gnu_cxx::operator!=(&local_38,&local_40);
    if (!bVar1) break;
    ppSVar2 = __gnu_cxx::
              __normal_iterator<flatbuffers::ServiceDef_*const_*,_std::vector<flatbuffers::ServiceDef_*,_std::allocator<flatbuffers::ServiceDef_*>_>_>
              ::operator*(&local_38);
    if ((((*ppSVar2)->super_Definition).generated & 1U) == 0) {
      it._M_current._4_4_ = it._M_current._4_4_ + 1;
    }
    __gnu_cxx::
    __normal_iterator<flatbuffers::ServiceDef_*const_*,_std::vector<flatbuffers::ServiceDef_*,_std::allocator<flatbuffers::ServiceDef_*>_>_>
    ::operator++(&local_38);
  }
  if (it._M_current._4_4_ == 0) {
    parser_local._7_1_ = true;
  }
  else {
    GoGRPCGenerator::GoGRPCGenerator(&local_d8,parser,path,file_name);
    parser_local._7_1_ = GoGRPCGenerator::generate(&local_d8);
    GoGRPCGenerator::~GoGRPCGenerator(&local_d8);
  }
  return parser_local._7_1_;
}

Assistant:

bool GenerateGoGRPC(const Parser &parser, const std::string &path,
                    const std::string &file_name) {
  int nservices = 0;
  for (auto it = parser.services_.vec.begin(); it != parser.services_.vec.end();
       ++it) {
    if (!(*it)->generated) nservices++;
  }
  if (!nservices) return true;
  return GoGRPCGenerator(parser, path, file_name).generate();
}